

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall github111116::ConsoleLogger::print<char[35]>(ConsoleLogger *this,char (*t) [35])

{
  char (*t_local) [35];
  ConsoleLogger *this_local;
  
  std::operator<<(this->out,*t);
  print(this);
  return;
}

Assistant:

void ConsoleLogger::print(const T& t)
{
	out << t;
	print();
}